

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithQueryDepsLogTest::~BuildWithQueryDepsLogTest(BuildWithQueryDepsLogTest *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~BuildWithQueryDepsLogTest() {
    log_.Close();
  }